

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t exr_set_channels(exr_context_t ctxt,int part_index,exr_attr_chlist_t *channels)

{
  long lVar1;
  long lVar2;
  exr_attribute_t *peVar3;
  exr_attr_box2i_t *peVar4;
  exr_result_t eVar5;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar6;
  exr_attr_chlist_t clist;
  anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 local_30;
  anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 aStack_28;
  
  if (channels == (exr_attr_chlist_t *)0x0) {
    eVar5 = (**(code **)(ctxt + 0x40))(ctxt,3,"No channels provided for channel list");
    return eVar5;
  }
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar5 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar5;
  }
  if (*ctxt == (_priv_exr_context_t)0x3) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar6 = 0x15;
  }
  else {
    if (*ctxt != (_priv_exr_context_t)0x0) {
      lVar1 = *(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
      lVar2 = *(long *)(lVar1 + 0x20);
      if (lVar2 == 0) {
        eVar5 = exr_attr_list_add(ctxt,(exr_attribute_list_t *)(lVar1 + 8),"channels",
                                  EXR_ATTR_CHLIST,0,(uint8_t **)0x0,
                                  (exr_attribute_t **)(lVar1 + 0x20));
      }
      else {
        eVar5 = 0;
        if (*(int *)(lVar2 + 0x14) != 3) {
          eVar5 = (**(code **)(ctxt + 0x48))
                            (ctxt,6,"Invalid required attribute type \'%s\' for \'%s\'",
                             *(undefined8 *)(lVar2 + 8),"channels",*(code **)(ctxt + 0x48));
          return eVar5;
        }
      }
      if (eVar5 != 0) {
        return eVar5;
      }
      peVar3 = *(exr_attribute_t **)(lVar1 + 0x20);
      eVar5 = exr_attr_chlist_duplicate(ctxt,(exr_attr_chlist_t *)&local_30.field_0,channels);
      if (eVar5 != 0) {
        return eVar5;
      }
      exr_attr_chlist_destroy(ctxt,(peVar3->field_6).chlist);
      peVar4 = (peVar3->field_6).box2i;
      (peVar4->min).field_0 = local_30;
      (peVar4->max).field_0 = aStack_28;
      return 0;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar6 = 8;
  }
  eVar5 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar6);
  return eVar5;
}

Assistant:

exr_result_t
exr_set_channels (
    exr_context_t ctxt, int part_index, const exr_attr_chlist_t* channels)
{
    if (!channels)
        return EXR_CTXT (ctxt)->report_error (
            EXR_CTXT (ctxt),
            EXR_ERR_INVALID_ARGUMENT,
            "No channels provided for channel list");

    REQ_ATTR_FIND_CREATE (channels, EXR_ATTR_CHLIST);
    if (rv == EXR_ERR_SUCCESS)
    {
        exr_attr_chlist_t clist;

        rv = exr_attr_chlist_duplicate (ctxt, &clist, channels);
        if (rv != EXR_ERR_SUCCESS) return EXR_UNLOCK_AND_RETURN_PCTXT (rv);

        exr_attr_chlist_destroy (ctxt, attr->chlist);
        *(attr->chlist) = clist;
    }
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}